

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createDeviceFeatures2Test
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *vkp;
  VkDevice_s *device;
  VkInstance_s *instance;
  bool bVar1;
  VkResult result;
  VkPhysicalDevice physicalDevice;
  VkQueue queue;
  NotSupportedError *this;
  float queuePriority;
  RefBase<vk::VkDevice_s_*> local_818;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledExts;
  RefBase<vk::VkInstance_s_*> local_7a8;
  Maybe<unsigned_int> local_790;
  undefined8 uStack_780;
  undefined4 local_778;
  float *local_770;
  InstanceDriver vki;
  VkPhysicalDeviceFeatures2KHR enabledFeatures;
  DeviceDriver vkd;
  
  vkp = context->m_platformInterface;
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &enabledFeatures,vkp,(char *)0x0);
  enabledExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enabledExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  enabledExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vki,"VK_KHR_get_physical_device_properties2",
             (allocator<char> *)&queuePriority);
  local_790.m_ptr = (uint *)0x0;
  local_818.m_data.object = (VkDevice_s *)0x0;
  ::vk::RequiredExtension::RequiredExtension
            ((RequiredExtension *)&vkd,(string *)&vki,&local_790,(Maybe<unsigned_int> *)&local_818);
  bVar1 = ::vk::isExtensionSupported
                    ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                      *)&enabledFeatures,(RequiredExtension *)&vkd);
  std::__cxx11::string::~string((string *)&vkd);
  std::__cxx11::string::~string((string *)&vki);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vkd,"VK_KHR_get_physical_device_properties2",(allocator<char> *)&vki);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&enabledExts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vkd);
    std::__cxx11::string::~string((string *)&vkd);
    vkd.super_DeviceInterface._vptr_DeviceInterface = (_func_int **)0x0;
    vkd.m_vk.destroyDevice = (DestroyDeviceFunc)0x0;
    vkd.m_vk.getDeviceQueue = (GetDeviceQueueFunc)0x0;
    ::vk::createDefaultInstance
              ((Move<vk::VkInstance_s_*> *)&vki,vkp,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&vkd,&enabledExts,(VkAllocationCallbacks *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&vkd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&enabledExts);
    std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
    ~_Vector_base((_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                   *)&enabledFeatures);
    local_7a8.m_data.object = (VkInstance_s *)vki.super_InstanceInterface._vptr_InstanceInterface;
    local_7a8.m_data.deleter.m_destroyInstance = vki.m_vk.destroyInstance;
    local_7a8.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)vki.m_vk.enumeratePhysicalDevices;
    vki.super_InstanceInterface._vptr_InstanceInterface = (_func_int **)0x0;
    vki.m_vk.destroyInstance = (DestroyInstanceFunc)0x0;
    vki.m_vk.enumeratePhysicalDevices = (EnumeratePhysicalDevicesFunc)0x0;
    ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)&vki);
    instance = local_7a8.m_data.object;
    ::vk::InstanceDriver::InstanceDriver(&vki,vkp,local_7a8.m_data.object);
    physicalDevice =
         ::vk::chooseDevice(&vki.super_InstanceInterface,instance,context->m_testCtx->m_cmdLine);
    enabledExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(enabledExts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
    enabledExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_100000000;
    queuePriority = 1.0;
    local_790.m_ptr = (uint *)CONCAT44(local_790.m_ptr._4_4_,2);
    local_790.field_1.m_align = 0;
    uStack_780 = 0;
    local_778 = 1;
    local_770 = &queuePriority;
    enabledFeatures.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
    enabledFeatures.pNext = (void *)0x0;
    enabledExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&enabledFeatures;
    ::vk::InstanceDriver::getPhysicalDeviceFeatures2KHR(&vki,physicalDevice,&enabledFeatures);
    ::vk::createDevice((Move<vk::VkDevice_s_*> *)&vkd,&vki.super_InstanceInterface,physicalDevice,
                       (VkDeviceCreateInfo *)&enabledExts,(VkAllocationCallbacks *)0x0);
    local_818.m_data.deleter.m_allocator = (VkAllocationCallbacks *)vkd.m_vk.getDeviceQueue;
    local_818.m_data.object = (VkDevice_s *)vkd.super_DeviceInterface._vptr_DeviceInterface;
    local_818.m_data.deleter.m_destroyDevice = vkd.m_vk.destroyDevice;
    vkd.super_DeviceInterface._vptr_DeviceInterface = (_func_int **)0x0;
    vkd.m_vk.destroyDevice = (DestroyDeviceFunc)0x0;
    vkd.m_vk.getDeviceQueue = (GetDeviceQueueFunc)0x0;
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase((RefBase<vk::VkDevice_s_*> *)&vkd);
    device = local_818.m_data.object;
    ::vk::DeviceDriver::DeviceDriver(&vkd,&vki.super_InstanceInterface,local_818.m_data.object);
    queue = ::vk::getDeviceQueue(&vkd.super_DeviceInterface,device,0,0);
    result = ::vk::DeviceDriver::queueWaitIdle(&vkd,queue);
    ::vk::checkResult(result,"vkd.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                      ,0x2b1);
    ::vk::DeviceDriver::~DeviceDriver(&vkd);
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_818);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vkd,"Pass",(allocator<char> *)&local_818);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&vkd);
    std::__cxx11::string::~string((string *)&vkd);
    ::vk::InstanceDriver::~InstanceDriver(&vki);
    ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_7a8);
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vki,"VK_KHR_get_physical_device_properties2",
             (allocator<char> *)&queuePriority);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vkd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vki,
                 " is not supported");
  tcu::NotSupportedError::NotSupportedError
            (this,(char *)vkd.super_DeviceInterface._vptr_DeviceInterface,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
             ,0x27c);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus createDeviceFeatures2Test (Context& context)
{
	const PlatformInterface&		vkp						= context.getPlatformInterface();
	const Unique<VkInstance>		instance				(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki						(vkp, instance.get());
	const VkPhysicalDevice			physicalDevice			= chooseDevice(vki, instance.get(), context.getTestContext().getCommandLine());
	const deUint32					queueFamilyIndex		= 0;
	const deUint32					queueCount				= 1;
	const deUint32					queueIndex				= 0;
	const float						queuePriority			= 1.0f;

	VkPhysicalDeviceFeatures2KHR	enabledFeatures;
	const VkDeviceQueueCreateInfo	deviceQueueCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
		DE_NULL,
		(VkDeviceQueueCreateFlags)0u,
		queueFamilyIndex,
		queueCount,
		&queuePriority,
	};
	const VkDeviceCreateInfo		deviceCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,
		&enabledFeatures,
		(VkDeviceCreateFlags)0u,
		1,
		&deviceQueueCreateInfo,
		0,
		DE_NULL,
		0,
		DE_NULL,
		DE_NULL,
	};

	// Populate enabledFeatures
	enabledFeatures.sType		= VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
	enabledFeatures.pNext		= DE_NULL;

	vki.getPhysicalDeviceFeatures2KHR(physicalDevice, &enabledFeatures);

	{
		const Unique<VkDevice>	device		(createDevice(vki, physicalDevice, &deviceCreateInfo));
		const DeviceDriver		vkd			(vki, device.get());
		const VkQueue			queue		= getDeviceQueue(vkd, *device, queueFamilyIndex, queueIndex);

		VK_CHECK(vkd.queueWaitIdle(queue));
	}

	return tcu::TestStatus::pass("Pass");
}